

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

GCstr * lj_ctype_repr(lua_State *L,CTypeID id,GCstr *name)

{
  long in_RDX;
  long in_RDI;
  CTRepr ctr;
  global_State *g;
  char *local_250;
  char *local_248;
  CTState *local_240;
  int local_230;
  int local_22c;
  CTypeID in_stack_fffffffffffffddc;
  CTRepr *in_stack_fffffffffffffde0;
  size_t in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  lua_State *in_stack_fffffffffffffe20;
  char acStack_128 [256];
  ulong local_28;
  GCstr *local_8;
  
  local_28 = (ulong)*(uint *)(in_RDI + 8);
  local_250 = acStack_128;
  local_240 = (CTState *)(ulong)*(uint *)(local_28 + 0x194);
  local_22c = 1;
  local_230 = 0;
  local_248 = local_250;
  if (in_RDX != 0) {
    ctype_prepstr((CTRepr *)&local_250,(char *)(in_RDX + 0x10),*(MSize *)(in_RDX + 0xc));
  }
  ctype_repr(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
  if (local_22c == 0) {
    local_8 = lj_str_new(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe10);
  }
  else {
    local_8 = lj_str_new(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe10);
  }
  return local_8;
}

Assistant:

GCstr *lj_ctype_repr(lua_State *L, CTypeID id, GCstr *name)
{
  global_State *g = G(L);
  CTRepr ctr;
  ctr.pb = ctr.pe = &ctr.buf[CTREPR_MAX/2];
  ctr.cts = ctype_ctsG(g);
  ctr.L = L;
  ctr.ok = 1;
  ctr.needsp = 0;
  if (name) ctype_prepstr(&ctr, strdata(name), name->len);
  ctype_repr(&ctr, id);
  if (LJ_UNLIKELY(!ctr.ok)) return lj_str_newlit(L, "?");
  return lj_str_new(L, ctr.pb, ctr.pe - ctr.pb);
}